

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,long iter,
               sunrealtype *R,sunrealtype *gamma)

{
  N_Vector_Ops p_Var1;
  sunrealtype *psVar2;
  N_Vector *pp_Var3;
  long *plVar4;
  undefined1 auVar5 [16];
  int iVar6;
  ulong uVar7;
  long lVar8;
  sunrealtype *psVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  sunrealtype *psVar16;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  double __x;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  p_Var1 = kin_mem->kin_vtemp2->ops;
  if ((p_Var1->nvdotprodlocal == (_func_sunrealtype_N_Vector_N_Vector *)0x0) &&
     (p_Var1->nvdotprodmultilocal ==
      (_func_SUNErrCode_int_N_Vector_N_Vector_ptr_sunrealtype_ptr *)0x0)) {
    bVar21 = true;
  }
  else {
    bVar21 = p_Var1->nvdotprodmultiallreduce == (_func_SUNErrCode_int_N_Vector_sunrealtype_ptr *)0x0
    ;
  }
  psVar2 = kin_mem->kin_cv;
  pp_Var3 = kin_mem->kin_Xv;
  plVar4 = kin_mem->kin_ipt_map;
  lVar12 = iter + -1;
  uVar10 = lVar12 % kin_mem->kin_m_aa;
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,gval,xold,fv);
  if (0 < iter) {
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,gval,kin_mem->kin_gold_aa,
                 kin_mem->kin_dg_aa[uVar10]);
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,fv,kin_mem->kin_fold_aa,
                 kin_mem->kin_df_aa[uVar10]);
  }
  N_VScale(0x3ff0000000000000,gval,kin_mem->kin_gold_aa);
  N_VScale(0x3ff0000000000000,fv,kin_mem->kin_fold_aa);
  if (iter == 1) {
    dVar26 = (double)N_VDotProd(kin_mem->kin_df_aa[uVar10],kin_mem->kin_df_aa[uVar10]);
    dVar22 = 0.0;
    if (0.0 < dVar26) {
      dVar22 = (double)N_VDotProd(kin_mem->kin_df_aa[uVar10],kin_mem->kin_df_aa[uVar10]);
      if (dVar22 < 0.0) {
        dVar22 = sqrt(dVar22);
      }
      else {
        dVar22 = SQRT(dVar22);
      }
    }
    *R = dVar22;
    N_VScale(1.0 / dVar22,kin_mem->kin_df_aa[uVar10],kin_mem->kin_q_aa[uVar10]);
    *plVar4 = 0;
  }
  else {
    if (iter == 0) {
      if (kin_mem->kin_damping_aa == 0) {
        iVar6 = N_VScale(0x3ff0000000000000,gval,x);
        return iVar6;
      }
      iVar6 = N_VLinearSum(1.0 - kin_mem->kin_beta,kin_mem->kin_beta_aa,xold,gval,x);
      return iVar6;
    }
    if (kin_mem->kin_m_aa < iter) {
      lVar12 = kin_mem->kin_m_aa;
      if (lVar12 < 2) {
        lVar8 = lVar12 + -1;
      }
      else {
        lVar18 = 0x10;
        psVar9 = R;
        lVar14 = 0;
        do {
          lVar20 = lVar14 + 1;
          dVar26 = R[lVar12 * lVar20 + lVar14];
          dVar22 = R[lVar12 * lVar20 + lVar14 + 1];
          __x = dVar26 * dVar26 + dVar22 * dVar22;
          dVar23 = 0.0;
          if (0.0 < __x) {
            if (__x < 0.0) {
              dVar23 = sqrt(__x);
            }
            else {
              dVar23 = SQRT(__x);
            }
          }
          auVar27._8_8_ = dVar26;
          auVar27._0_8_ = dVar22;
          auVar31._8_8_ = dVar23;
          auVar31._0_8_ = dVar23;
          auVar27 = divpd(auVar27,auVar31);
          lVar12 = kin_mem->kin_m_aa;
          R[lVar12 * lVar20 + lVar14] = dVar23;
          R[lVar12 * lVar20 + lVar14 + 1] = 0.0;
          if ((lVar14 < lVar12 + -1) && (lVar8 = lVar14 + 2, lVar8 < lVar12)) {
            lVar11 = lVar12 * lVar18;
            do {
              dVar26 = *(double *)((long)psVar9 + lVar11 + 8);
              dVar22 = *(double *)((long)psVar9 + lVar11) * -auVar27._0_8_ + dVar26 * auVar27._8_8_;
              auVar5._8_4_ = SUB84(dVar22,0);
              auVar5._0_8_ = *(double *)((long)psVar9 + lVar11) * auVar27._8_8_ +
                             dVar26 * auVar27._0_8_;
              auVar5._12_4_ = (int)((ulong)dVar22 >> 0x20);
              *(undefined1 (*) [16])((long)psVar9 + lVar11) = auVar5;
              lVar8 = lVar8 + 1;
              lVar11 = lVar11 + lVar12 * 8;
            } while (lVar8 < lVar12);
          }
          N_VLinearSum(kin_mem->kin_q_aa[lVar14],kin_mem->kin_q_aa[lVar20],kin_mem->kin_vtemp2);
          N_VLinearSum(kin_mem->kin_q_aa[lVar14],kin_mem->kin_q_aa[lVar20]);
          N_VScale(0x3ff0000000000000,kin_mem->kin_vtemp2,kin_mem->kin_q_aa[lVar14]);
          lVar12 = kin_mem->kin_m_aa;
          lVar8 = lVar12 + -1;
          psVar9 = psVar9 + 1;
          lVar18 = lVar18 + 8;
          lVar14 = lVar20;
        } while (lVar20 < lVar8);
      }
      if (1 < lVar12) {
        psVar9 = R + lVar12;
        lVar14 = 1;
        psVar16 = R;
        do {
          if (0 < lVar8) {
            lVar18 = 0;
            do {
              psVar16[lVar18] = psVar9[lVar18];
              lVar18 = lVar18 + 1;
            } while (lVar8 != lVar18);
          }
          lVar14 = lVar14 + 1;
          psVar9 = psVar9 + lVar12;
          psVar16 = psVar16 + lVar12;
        } while (lVar14 != lVar12);
      }
      if (kin_mem->kin_orth_aa == 1) {
        if (bVar21) {
          *kin_mem->kin_T_aa = 1.0;
          lVar12 = kin_mem->kin_m_aa;
          if (2 < lVar12) {
            uVar19 = 1;
            do {
              N_VDotProdMulti(uVar19 & 0xffffffff,kin_mem->kin_q_aa[uVar19],kin_mem->kin_q_aa,
                              kin_mem->kin_T_aa + lVar12 * uVar19);
              lVar12 = kin_mem->kin_m_aa;
              kin_mem->kin_T_aa[(lVar12 + 1) * uVar19] = 1.0;
              lVar8 = uVar19 + 2;
              uVar19 = uVar19 + 1;
            } while (lVar8 < lVar12);
          }
        }
        else {
          if (1 < lVar12) {
            lVar12 = kin_mem->kin_m_aa;
            uVar19 = 2;
            if (2 < lVar12) {
              do {
                N_VDotProdMultiLocal
                          (uVar19 & 0xffffffff,kin_mem->kin_q_aa[uVar19 - 1],kin_mem->kin_q_aa,
                           kin_mem->kin_T_aa + (uVar19 - 1) * lVar12);
                uVar19 = uVar19 + 1;
                lVar12 = kin_mem->kin_m_aa;
              } while ((long)uVar19 < lVar12);
            }
            N_VDotProdMultiAllReduce
                      ((int)lVar12 * (int)lVar12,kin_mem->kin_q_aa[uVar19 - 1],kin_mem->kin_T_aa);
          }
          auVar32 = _DAT_0011b110;
          auVar27 = _DAT_0011b100;
          uVar19 = kin_mem->kin_m_aa;
          if (1 < (long)uVar19) {
            psVar9 = kin_mem->kin_T_aa;
            lVar12 = uVar19 - 2;
            auVar24._8_4_ = (int)lVar12;
            auVar24._0_8_ = lVar12;
            auVar24._12_4_ = (int)((ulong)lVar12 >> 0x20);
            uVar15 = 0;
            auVar24 = auVar24 ^ _DAT_0011b110;
            do {
              auVar29._8_4_ = (int)uVar15;
              auVar29._0_8_ = uVar15;
              auVar29._12_4_ = (int)(uVar15 >> 0x20);
              auVar30 = (auVar29 | auVar27) ^ auVar32;
              if ((bool)(~(auVar30._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar30._0_4_ ||
                          auVar24._4_4_ < auVar30._4_4_) & 1)) {
                *psVar9 = 1.0;
              }
              if ((auVar30._12_4_ != auVar24._12_4_ || auVar30._8_4_ <= auVar24._8_4_) &&
                  auVar30._12_4_ <= auVar24._12_4_) {
                psVar9[uVar19 + 1] = 1.0;
              }
              uVar15 = uVar15 + 2;
              psVar9 = psVar9 + uVar19 * 2 + 2;
            } while ((uVar19 & 0x7ffffffffffffffe) != uVar15);
          }
        }
      }
      iVar6 = (int)kin_mem->kin_m_aa;
      (*kin_mem->kin_qr_func)
                (kin_mem->kin_q_aa,R,kin_mem->kin_df_aa[uVar10],iVar6 + -1,iVar6,
                 kin_mem->kin_qr_data);
      lVar12 = uVar10 + 1;
      if (lVar12 < kin_mem->kin_m_aa) {
        lVar14 = 0;
        do {
          lVar8 = lVar14 + 1;
          plVar4[lVar14] = lVar12 + lVar14;
          lVar18 = lVar12 + lVar14;
          lVar14 = lVar8;
        } while (lVar18 + 1 < kin_mem->kin_m_aa);
      }
      else {
        lVar8 = 0;
      }
      auVar27 = _DAT_0011b110;
      if (-1 < (long)uVar10) {
        auVar25._8_4_ = (int)uVar10;
        auVar25._0_8_ = uVar10;
        auVar25._12_4_ = (int)(uVar10 >> 0x20);
        lVar12 = 0;
        auVar25 = auVar25 ^ _DAT_0011b110;
        auVar28 = _DAT_0011b100;
        do {
          auVar32 = auVar28 ^ auVar27;
          if ((bool)(~(auVar32._4_4_ == auVar25._4_4_ && auVar25._0_4_ < auVar32._0_4_ ||
                      auVar25._4_4_ < auVar32._4_4_) & 1)) {
            plVar4[lVar8 + lVar12] = lVar12;
          }
          if ((auVar32._12_4_ != auVar25._12_4_ || auVar32._8_4_ <= auVar25._8_4_) &&
              auVar32._12_4_ <= auVar25._12_4_) {
            plVar4[lVar8 + lVar12 + 1] = lVar12 + 1;
          }
          lVar12 = lVar12 + 2;
          lVar14 = auVar28._8_8_;
          auVar28._0_8_ = auVar28._0_8_ + 2;
          auVar28._8_8_ = lVar14 + 2;
        } while ((uVar10 & 0x7ffffffffffffffe) + 2 != lVar12);
      }
    }
    else {
      (*kin_mem->kin_qr_func)
                (kin_mem->kin_q_aa,R,kin_mem->kin_df_aa[uVar10],(int)iter + -1,
                 (int)kin_mem->kin_m_aa,kin_mem->kin_qr_data);
      auVar27 = _DAT_0011b110;
      if (0 < iter) {
        auVar30._8_4_ = (int)lVar12;
        auVar30._0_8_ = lVar12;
        auVar30._12_4_ = (int)((ulong)lVar12 >> 0x20);
        uVar10 = 0;
        auVar30 = auVar30 ^ _DAT_0011b110;
        auVar32 = _DAT_0011b100;
        do {
          auVar31 = auVar32 ^ auVar27;
          if ((bool)(~(auVar31._4_4_ == auVar30._4_4_ && auVar30._0_4_ < auVar31._0_4_ ||
                      auVar30._4_4_ < auVar31._4_4_) & 1)) {
            plVar4[uVar10] = uVar10;
          }
          if ((auVar31._12_4_ != auVar30._12_4_ || auVar31._8_4_ <= auVar30._8_4_) &&
              auVar31._12_4_ <= auVar30._12_4_) {
            plVar4[uVar10 + 1] = uVar10 + 1;
          }
          uVar10 = uVar10 + 2;
          lVar12 = auVar32._8_8_;
          auVar32._0_8_ = auVar32._0_8_ + 2;
          auVar32._8_8_ = lVar12 + 2;
        } while ((iter + 1U & 0xfffffffffffffffe) != uVar10);
      }
    }
  }
  if (kin_mem->kin_m_aa < iter) {
    iter = kin_mem->kin_m_aa;
  }
  iVar6 = N_VDotProdMulti(iter & 0xffffffff,fv,kin_mem->kin_q_aa,gamma);
  if (iVar6 == 0) {
    *psVar2 = 1.0;
    *pp_Var3 = gval;
    if (iter < 1) {
      uVar10 = 1;
    }
    else {
      lVar8 = kin_mem->kin_m_aa;
      lVar12 = iter * 8;
      psVar9 = R + iter;
      lVar14 = 0;
      uVar15 = 1;
      uVar19 = iter;
      do {
        uVar7 = uVar19 - 1;
        psVar9 = psVar9 + -1;
        if ((long)uVar19 < iter) {
          lVar18 = kin_mem->kin_m_aa;
          dVar26 = gamma[uVar7];
          pdVar17 = (double *)(lVar18 * lVar12 + (long)psVar9);
          lVar20 = lVar14;
          do {
            dVar26 = dVar26 - *pdVar17 * gamma[iter + lVar20];
            gamma[uVar7] = dVar26;
            pdVar17 = pdVar17 + lVar18;
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0);
        }
        dVar26 = gamma[uVar7];
        dVar22 = R[(lVar8 + 1) * uVar7];
        gamma[uVar7] = dVar26 / dVar22;
        psVar2[uVar15] = -(dVar26 / dVar22);
        pp_Var3[uVar15] = kin_mem->kin_dg_aa[plVar4[uVar7]];
        uVar10 = uVar15 + 1;
        lVar14 = lVar14 + -1;
        lVar12 = lVar12 + -8;
        bVar21 = uVar15 != iter;
        uVar15 = uVar10;
        uVar19 = uVar7;
      } while (bVar21);
    }
    if (kin_mem->kin_damping_aa != 0) {
      dVar26 = 1.0 - kin_mem->kin_beta_aa;
      psVar2[uVar10 & 0xffffffff] = -dVar26;
      pp_Var3[uVar10 & 0xffffffff] = fv;
      uVar13 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar13;
      if (0 < iter) {
        lVar12 = 0;
        do {
          psVar2[(ulong)uVar13 + lVar12] = gamma[iter - 1] * dVar26;
          pp_Var3[(ulong)uVar13 + lVar12] = kin_mem->kin_df_aa[plVar4[iter - 1]];
          lVar12 = lVar12 + 1;
          uVar10 = iter - 1;
          bVar21 = 0 < iter;
          iter = uVar10;
        } while (uVar10 != 0 && bVar21);
        uVar10 = (ulong)(uVar13 + (int)lVar12);
      }
    }
    iVar6 = N_VLinearCombination(uVar10,psVar2,pp_Var3,x);
    return iVar6;
  }
  return iVar6;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, N_Vector x,
                       N_Vector xold, long int iter, sunrealtype* R,
                       sunrealtype* gamma)
{
  int retval;
  long int i_pt, i, j, lAA;
  long int* ipt_map;
  sunrealtype alfa;
  sunrealtype onembeta;
  sunrealtype a, b, temp, c, s;
  sunbooleantype dotprodSB = SUNFALSE;

  /* local shortcuts for fused vector operation */
  int nvec        = 0;
  sunrealtype* cv = kin_mem->kin_cv;
  N_Vector* Xv    = kin_mem->kin_Xv;

  /* local dot product flag for single buffer reductions */
  if ((kin_mem->kin_vtemp2->ops->nvdotprodlocal ||
       kin_mem->kin_vtemp2->ops->nvdotprodmultilocal) &&
      kin_mem->kin_vtemp2->ops->nvdotprodmultiallreduce)
  {
    dotprodSB = SUNTRUE;
  }

  ipt_map = kin_mem->kin_ipt_map;
  i_pt    = iter - 1 - ((iter - 1) / kin_mem->kin_m_aa) * kin_mem->kin_m_aa;
  N_VLinearSum(ONE, gval, -ONE, xold, fv);
  if (iter > 0)
  {
    /* compute dg_new = gval - gval_old */
    N_VLinearSum(ONE, gval, -ONE, kin_mem->kin_gold_aa, kin_mem->kin_dg_aa[i_pt]);
    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -ONE, kin_mem->kin_fold_aa, kin_mem->kin_df_aa[i_pt]);
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  /* on first iteration, do fixed point update */
  if (iter == 0)
  {
    if (kin_mem->kin_damping_aa)
    {
      /* damped fixed point */
      N_VLinearSum((ONE - kin_mem->kin_beta), xold, kin_mem->kin_beta_aa, gval,
                   x);
    }
    else
    {
      /* standard fixed point */
      N_VScale(ONE, gval, x);
    }
    return (0);
  }

  /* update data structures based on current iteration index */

  if (iter == 1)
  {
    /* second iteration */
    R[0] =
      SUNRsqrt(N_VDotProd(kin_mem->kin_df_aa[i_pt], kin_mem->kin_df_aa[i_pt]));
    alfa = ONE / R[0];
    N_VScale(alfa, kin_mem->kin_df_aa[i_pt], kin_mem->kin_q_aa[i_pt]);
    ipt_map[0] = 0;
  }
  else if (iter <= kin_mem->kin_m_aa)
  {
    /* another iteration before we've reached maa */

    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R, kin_mem->kin_df_aa[i_pt],
                         (int)iter - 1, (int)kin_mem->kin_m_aa,
                         (void*)kin_mem->kin_qr_data);

    /* update iteration map */
    for (j = 0; j < iter; j++) { ipt_map[j] = j; }
  }
  else
  {
    /* we've filled the acceleration subspace, so start recycling */

    /* Delete left-most column vector from QR factorization */
    for (i = 0; i < kin_mem->kin_m_aa - 1; i++)
    {
      a    = R[(i + 1) * kin_mem->kin_m_aa + i];
      b    = R[(i + 1) * kin_mem->kin_m_aa + i + 1];
      temp = SUNRsqrt(a * a + b * b);
      c    = a / temp;
      s    = b / temp;
      R[(i + 1) * kin_mem->kin_m_aa + i]     = temp;
      R[(i + 1) * kin_mem->kin_m_aa + i + 1] = ZERO;
      /* OK to re-use temp */
      if (i < kin_mem->kin_m_aa - 1)
      {
        for (j = i + 2; j < kin_mem->kin_m_aa; j++)
        {
          a                                = R[j * kin_mem->kin_m_aa + i];
          b                                = R[j * kin_mem->kin_m_aa + i + 1];
          temp                             = c * a + s * b;
          R[j * kin_mem->kin_m_aa + i + 1] = -s * a + c * b;
          R[j * kin_mem->kin_m_aa + i]     = temp;
        }
      }
      N_VLinearSum(c, kin_mem->kin_q_aa[i], s, kin_mem->kin_q_aa[i + 1],
                   kin_mem->kin_vtemp2);
      N_VLinearSum(-s, kin_mem->kin_q_aa[i], c, kin_mem->kin_q_aa[i + 1],
                   kin_mem->kin_q_aa[i + 1]);
      N_VScale(ONE, kin_mem->kin_vtemp2, kin_mem->kin_q_aa[i]);
    }

    /* Shift R to the left by one. */
    for (i = 1; i < kin_mem->kin_m_aa; i++)
    {
      for (j = 0; j < kin_mem->kin_m_aa - 1; j++)
      {
        R[(i - 1) * kin_mem->kin_m_aa + j] = R[i * kin_mem->kin_m_aa + j];
      }
    }

    /* If ICWY orthogonalization, then update T */
    if (kin_mem->kin_orth_aa == KIN_ORTH_ICWY)
    {
      if (dotprodSB)
      {
        if (i > 1)
        {
          for (i = 2; i < kin_mem->kin_m_aa; i++)
          {
            N_VDotProdMultiLocal((int)i, kin_mem->kin_q_aa[i - 1],
                                 kin_mem->kin_q_aa,
                                 kin_mem->kin_T_aa + (i - 1) * kin_mem->kin_m_aa);
          }
          N_VDotProdMultiAllReduce((int)(kin_mem->kin_m_aa * kin_mem->kin_m_aa),
                                   kin_mem->kin_q_aa[i - 1], kin_mem->kin_T_aa);
        }
        for (i = 1; i < kin_mem->kin_m_aa; i++)
        {
          kin_mem->kin_T_aa[(i - 1) * kin_mem->kin_m_aa + (i - 1)] = ONE;
        }
      }
      else
      {
        kin_mem->kin_T_aa[0] = ONE;
        for (i = 2; i < kin_mem->kin_m_aa; i++)
        {
          N_VDotProdMulti((int)i - 1, kin_mem->kin_q_aa[i - 1], kin_mem->kin_q_aa,
                          kin_mem->kin_T_aa + (i - 1) * kin_mem->kin_m_aa);
          kin_mem->kin_T_aa[(i - 1) * kin_mem->kin_m_aa + (i - 1)] = ONE;
        }
      }
    }

    /* Add the new df vector */
    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R, kin_mem->kin_df_aa[i_pt],
                         (int)kin_mem->kin_m_aa - 1, (int)kin_mem->kin_m_aa,
                         (void*)kin_mem->kin_qr_data);

    /* Update the iteration map */
    j = 0;
    for (i = i_pt + 1; i < kin_mem->kin_m_aa; i++) { ipt_map[j++] = i; }
    for (i = 0; i < (i_pt + 1); i++) { ipt_map[j++] = i; }
  }

  /* Solve least squares problem and update solution */
  lAA = iter;
  if (kin_mem->kin_m_aa < iter) { lAA = kin_mem->kin_m_aa; }

  retval = N_VDotProdMulti((int)lAA, fv, kin_mem->kin_q_aa, gamma);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  /* set arrays for fused vector operation */
  cv[0] = ONE;
  Xv[0] = gval;
  nvec  = 1;

  for (i = lAA - 1; i > -1; i--)
  {
    for (j = i + 1; j < lAA; j++)
    {
      gamma[i] = gamma[i] - R[j * kin_mem->kin_m_aa + i] * gamma[j];
    }
    gamma[i] = gamma[i] / R[i * kin_mem->kin_m_aa + i];

    cv[nvec] = -gamma[i];
    Xv[nvec] = kin_mem->kin_dg_aa[ipt_map[i]];
    nvec += 1;
  }

  /* if enabled, apply damping */
  if (kin_mem->kin_damping_aa)
  {
    onembeta = (ONE - kin_mem->kin_beta_aa);
    cv[nvec] = -onembeta;
    Xv[nvec] = fv;
    nvec += 1;
    for (i = lAA - 1; i > -1; i--)
    {
      cv[nvec] = onembeta * gamma[i];
      Xv[nvec] = kin_mem->kin_df_aa[ipt_map[i]];
      nvec += 1;
    }
  }

  /* update solution */
  retval = N_VLinearCombination(nvec, cv, Xv, x);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  return 0;
}